

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_string_vector.cc
# Opt level: O2

vector<absl::string_view,_std::allocator<absl::string_view>_> * __thiscall
s2coding::EncodedStringVector::Decode
          (vector<absl::string_view,_std::allocator<absl::string_view>_> *__return_storage_ptr__,
          EncodedStringVector *this)

{
  pointer psVar1;
  int i;
  ulong uVar2;
  long lVar3;
  ulong __n;
  string_view sVar4;
  allocator_type local_29;
  
  __n = (ulong)(this->offsets_).size_;
  std::vector<absl::string_view,_std::allocator<absl::string_view>_>::vector
            (__return_storage_ptr__,__n,&local_29);
  lVar3 = 8;
  for (uVar2 = 0; __n != uVar2; uVar2 = uVar2 + 1) {
    sVar4 = operator[](this,(int)uVar2);
    psVar1 = (__return_storage_ptr__->
             super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *(char **)((long)psVar1 + lVar3 + -8) = sVar4.ptr_;
    *(size_type *)((long)&psVar1->ptr_ + lVar3) = sVar4.length_;
    lVar3 = lVar3 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string_view> EncodedStringVector::Decode() const {
  size_t n = size();
  vector<string_view> result(n);
  for (int i = 0; i < n; ++i) {
    result[i] = (*this)[i];
  }
  return result;
}